

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimerinfo_unix.cpp
# Opt level: O1

optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> __thiscall
QTimerInfoList::timerWait(QTimerInfoList *this)

{
  QTimerInfo **ppQVar1;
  long lVar2;
  undefined4 uVar3;
  QTimerInfo **ppQVar4;
  QTimerInfo **ppQVar5;
  ulong uVar6;
  long lVar7;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar8;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  (this->currentTime).__d.__r = lVar2;
  ppQVar5 = (this->timers).d.ptr;
  uVar6 = (this->timers).d.size;
  ppQVar1 = ppQVar5 + uVar6;
  ppQVar4 = ppQVar5;
  if (0 < (long)uVar6 >> 2) {
    ppQVar4 = ppQVar5 + (uVar6 & 0xfffffffffffffffc);
    lVar7 = ((long)uVar6 >> 2) + 1;
    ppQVar5 = ppQVar5 + 2;
    do {
      if (ppQVar5[-2]->activateRef == (QTimerInfo **)0x0) {
        ppQVar5 = ppQVar5 + -2;
        goto LAB_003cb211;
      }
      if (ppQVar5[-1]->activateRef == (QTimerInfo **)0x0) {
        ppQVar5 = ppQVar5 + -1;
        goto LAB_003cb211;
      }
      if ((*ppQVar5)->activateRef == (QTimerInfo **)0x0) goto LAB_003cb211;
      if (ppQVar5[1]->activateRef == (QTimerInfo **)0x0) {
        ppQVar5 = ppQVar5 + 1;
        goto LAB_003cb211;
      }
      lVar7 = lVar7 + -1;
      ppQVar5 = ppQVar5 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)ppQVar1 - (long)ppQVar4 >> 3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      ppQVar5 = ppQVar1;
      if ((lVar7 != 3) || (ppQVar5 = ppQVar4, (*ppQVar4)->activateRef == (QTimerInfo **)0x0))
      goto LAB_003cb211;
      ppQVar4 = ppQVar4 + 1;
    }
    ppQVar5 = ppQVar4;
    if ((*ppQVar4)->activateRef == (QTimerInfo **)0x0) goto LAB_003cb211;
    ppQVar4 = ppQVar4 + 1;
  }
  ppQVar5 = ppQVar4;
  if ((*ppQVar4)->activateRef != (QTimerInfo **)0x0) {
    ppQVar5 = ppQVar1;
  }
LAB_003cb211:
  if (ppQVar5 == ppQVar1) {
    uVar3 = 0;
  }
  else {
    lVar7 = ((*ppQVar5)->timeout).__d.__r;
    uVar3 = (undefined4)CONCAT71((int7)((ulong)*ppQVar5 >> 8),1);
    uVar6 = lVar7 - lVar2;
    if (uVar6 == 0 || lVar7 < lVar2) {
      lVar2 = 0;
    }
    else {
      lVar2 = ((ulong)((long)((uVar6 / 1000000) * 1000000) < (long)uVar6) + uVar6 / 1000000) *
              1000000;
    }
  }
  oVar8.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>._8_4_ =
       uVar3;
  oVar8.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
  _M_payload = (_Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>)lVar2;
  oVar8.super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>._12_4_ =
       0;
  return (optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
         oVar8.
         super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>;
}

Assistant:

std::optional<QTimerInfoList::Duration> QTimerInfoList::timerWait()
{
    steady_clock::time_point now = updateCurrentTime();

    auto isWaiting = [](QTimerInfo *tinfo) { return !tinfo->activateRef; };
    // Find first waiting timer not already active
    auto it = std::find_if(timers.cbegin(), timers.cend(), isWaiting);
    if (it == timers.cend())
        return std::nullopt;

    Duration timeToWait = (*it)->timeout - now;
    if (timeToWait > 0ns)
        return roundToMillisecond(timeToWait);
    return 0ms;
}